

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_memory_dev(Integer g_a,char *device)

{
  global_array_t *pgVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  uint uVar6;
  
  sVar3 = strlen(device);
  uVar6 = (uint)sVar3;
  if ((int)uVar6 < 0x20) {
    if ((int)uVar6 < 1) {
      iVar2 = 0;
      goto LAB_001117a3;
    }
  }
  else {
    pnga_error("Illegal memory device name specified. Device name exceeds length: ",0x1f);
  }
  pp_Var4 = __ctype_tolower_loc();
  uVar5 = 0;
  do {
    device[uVar5] = (char)(*pp_Var4)[device[uVar5]];
    uVar5 = uVar5 + 1;
  } while ((uVar6 & 0x7fffffff) != uVar5);
  uVar5 = 0;
  iVar2 = 0;
  do {
    if (device[uVar5] != ' ') {
      device[iVar2] = device[uVar5];
      iVar2 = iVar2 + 1;
    }
    uVar5 = uVar5 + 1;
  } while ((uVar6 & 0x7fffffff) != uVar5);
LAB_001117a3:
  if (iVar2 < 0x1f && (int)uVar6 < iVar2) {
    device[iVar2] = '\0';
  }
  pgVar1 = GA + g_a + 1000;
  GA[g_a + 1000].mem_dev_set = 1;
  strcpy(pgVar1->mem_dev,device);
  return;
}

Assistant:

void pnga_set_memory_dev(Integer g_a, char *device) {
  Integer ga_handle = g_a + GA_OFFSET;
  int len = strlen(device);
  int i, ilen;
  if (len>FNAM) {
    pnga_error("Illegal memory device name specified. Device name exceeds length: ",
        FNAM);
  }
  /* convert device name to lower case */
  for (i=0; i<len; i++) {
    device[i] = tolower(device[i]);
  }
  /* remove blanks */
  ilen = 0;
  for (i=0; i<len; i++) {
    if (device[i] != ' ') {
      device [ilen] = device[i];
      ilen++;
    }
  }
  if (ilen > len && ilen < FNAM) device[ilen] = '\0';
  GA[ga_handle].mem_dev_set = 1;
  strcpy(GA[ga_handle].mem_dev,device);
}